

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O1

void test_cancel_without_arming(void)

{
  cio_error cVar1;
  cio_timer timer;
  cio_timer cStack_48;
  
  timerfd_create_fake.return_val = 5;
  cVar1 = cio_timer_init(&cStack_48,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x123,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_timer_cancel(&cStack_48);
  if (cVar1 != CIO_SUCCESS) {
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",0x126);
}

Assistant:

static void test_cancel_without_arming(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	err = cio_timer_cancel(&timer);
	TEST_ASSERT(err != CIO_SUCCESS);
}